

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall TopologicalSortTest_Empty_Test::TestBody(TopologicalSortTest_Empty_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *message;
  AssertHelper local_1a8;
  Message local_1a0;
  TopologicalOrdersImpl<std::monostate> local_198;
  TopologicalOrdersImpl<std::monostate> local_128;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  TopologicalOrders orders;
  Graph_conflict graph;
  TopologicalSortTest_Empty_Test *this_local;
  
  this_00 = &orders.selectors.
             super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)this_00);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_98,(Graph_conflict *)this_00);
  ::wasm::TopologicalOrdersImpl<std::monostate>::begin
            (&local_128,(TopologicalOrdersImpl<std::monostate> *)local_98);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            (&local_198,(TopologicalOrdersImpl<std::monostate> *)local_98);
  testing::internal::EqHelper::
  Compare<wasm::TopologicalOrdersImpl<std::monostate>,_wasm::TopologicalOrdersImpl<std::monostate>,_nullptr>
            ((EqHelper *)local_b8,"orders.begin()","orders.end()",&local_128,&local_198);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_198);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_98);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&orders.selectors.
                super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(TopologicalSortTest, Empty) {
  Graph graph;
  TopologicalOrders orders(graph);
  EXPECT_EQ(orders.begin(), orders.end());
}